

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  State *pSVar1;
  ModuleDesc *pMVar2;
  pointer pFVar3;
  Result RVar4;
  Enum EVar5;
  Location loc;
  Location loc_1;
  undefined1 local_118 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_108;
  pointer local_f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_f0;
  pointer local_d8;
  pointer pLStack_d0;
  pointer local_c8;
  u32 local_c0;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_b8;
  Location local_98;
  Var local_78;
  
  local_108.field_0.last_column = 0;
  local_118._0_8_ = (this->filename_)._M_len;
  local_118._8_8_ = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_108.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  Var::Var(&local_78,sig_index,&local_98);
  RVar4 = SharedValidator::OnFunction(&this->validator_,(Location *)local_118,&local_78);
  Var::~Var(&local_78);
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    pMVar2 = this->module_;
    pFVar3 = (pMVar2->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_118._8_4_ = pFVar3[sig_index].super_ExternType.kind;
    local_118._0_8_ = &PTR__FuncType_0022c890;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_108.field_0,
               &pFVar3[sig_index].params);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_f0,&pFVar3[sig_index].results);
    local_c8 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    pLStack_d0 = (pointer)0x0;
    local_c0 = 0xffffffff;
    local_b8.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::
    emplace_back<wabt::interp::FuncDesc>(&pMVar2->funcs,(FuncDesc *)local_118);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_b8);
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    local_118._0_8_ = &PTR__FuncType_0022c890;
    if (local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.field_1.offset != 0) {
      operator_delete((void *)local_108.field_1.offset,(long)local_f8 - local_108._0_8_);
    }
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,pFVar3 + sig_index);
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(
      validator_.OnFunction(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, Istream::kInvalidOffset, {}});
  func_types_.push_back(func_type);
  return Result::Ok;
}